

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O3

bool __thiscall
Fossilize::ConcurrentDatabase::write_exported_concurrent_hashes
          (ConcurrentDatabase *this,ResourceTag tag,ExportedMetadataConcurrentPrimedBlock *primed,
          uint64_t *total_count)

{
  ExportedMetadataConcurrentPrimedBlock *pEVar1;
  DatabaseInterface *pDVar2;
  pointer puVar3;
  ExportedMetadataConcurrentPrimedBlock EVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ExportedMetadataConcurrentPrimedBlock *pEVar8;
  ExportedMetadataConcurrentPrimedBlock *pEVar9;
  ExportedMetadataConcurrentPrimedBlock *pEVar10;
  ExportedMetadataConcurrentPrimedBlock EVar11;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_> *e;
  pointer puVar12;
  size_t hash_count;
  long local_48;
  uint64_t *local_40;
  ExportedMetadataConcurrentPrimedBlock *local_38;
  
  local_48 = 0;
  pDVar2 = (this->readonly_interface)._M_t.
           super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
           .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
  if (pDVar2 != (DatabaseInterface *)0x0) {
    iVar6 = (*pDVar2->_vptr_DatabaseInterface[6])(pDVar2,tag,&local_48,0);
    if ((char)iVar6 == '\0') {
      return false;
    }
    pDVar2 = (this->readonly_interface)._M_t.
             super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
             .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
    if ((pDVar2 != (DatabaseInterface *)0x0) &&
       (iVar6 = (*pDVar2->_vptr_DatabaseInterface[6])(pDVar2,tag,&local_48,primed),
       (char)iVar6 == '\0')) {
      return false;
    }
  }
  pEVar1 = primed + local_48;
  puVar3 = (this->extra_readonly).
           super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_40 = total_count;
  for (puVar12 = (this->extra_readonly).
                 super__Vector_base<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; local_38 = primed, puVar12 != puVar3;
      puVar12 = puVar12 + 1) {
    local_48 = 0;
    pDVar2 = (puVar12->_M_t).
             super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
             .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
    if (pDVar2 != (DatabaseInterface *)0x0) {
      iVar6 = (*pDVar2->_vptr_DatabaseInterface[6])(pDVar2,tag,&local_48,0);
      if ((char)iVar6 == '\0') {
        return false;
      }
      pDVar2 = (puVar12->_M_t).
               super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
               .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      if ((pDVar2 != (DatabaseInterface *)0x0) &&
         (iVar6 = (*pDVar2->_vptr_DatabaseInterface[6])(pDVar2,tag,&local_48), (char)iVar6 == '\0'))
      {
        return false;
      }
    }
    pEVar1 = pEVar1 + local_48;
    primed = local_38;
  }
  pEVar10 = primed;
  if ((long)pEVar1 - (long)primed != 0) {
    uVar7 = (long)pEVar1 - (long)primed >> 3;
    lVar5 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::__introsort_loop<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (primed,pEVar1,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<unsigned_long*,__gnu_cxx::__ops::_Iter_less_iter>(primed,pEVar1);
    pEVar10 = primed + 1;
    do {
      pEVar8 = pEVar10;
      pEVar10 = pEVar1;
      if (pEVar8 == pEVar1) goto LAB_00140c65;
      pEVar10 = pEVar8 + 1;
    } while (pEVar8[-1] != *pEVar8);
    pEVar9 = pEVar8 + -1;
    EVar11 = pEVar8[-1];
    for (; pEVar10 != pEVar1; pEVar10 = pEVar10 + 1) {
      EVar4 = *pEVar10;
      if (EVar11 != EVar4) {
        pEVar9[1] = EVar4;
        pEVar9 = pEVar9 + 1;
      }
      EVar11 = EVar4;
    }
    pEVar10 = pEVar9 + 1;
  }
LAB_00140c65:
  *local_40 = (long)pEVar10 - (long)primed >> 3;
  return true;
}

Assistant:

bool write_exported_concurrent_hashes(ResourceTag tag, ExportedMetadataConcurrentPrimedBlock *primed, uint64_t &total_count) const
	{
		auto *primed_begin = primed;
		size_t hash_count = 0;

		// This is an upper bound, we might prune it later, although in general we don't expect duplicates.
		if (readonly_interface &&
		    !readonly_interface->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
			return false;
		if (readonly_interface &&
		    !readonly_interface->get_hash_list_for_resource_tag(tag, &hash_count, primed))
			return false;
		primed += hash_count;

		for (auto &e : extra_readonly)
		{
			hash_count = 0;
			if (e && !e->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
				return false;
			if (e && !e->get_hash_list_for_resource_tag(tag, &hash_count, primed))
				return false;
			primed += hash_count;
		}

		std::sort(primed_begin, primed);
		primed = std::unique(primed_begin, primed);
		total_count = size_t(primed - primed_begin);
		return true;
	}